

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

void __thiscall Js::JavascriptLibrary::DumpLibraryByteCode(JavascriptLibrary *this)

{
  bool bVar1;
  EngineExtensionObjectBase *pEVar2;
  uint i;
  EngineInterfaceExtensionKind extensionKind;
  
  bVar1 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,DumpFlag);
  if (bVar1) {
    bVar1 = Phases::IsEnabled((Phases *)&DAT_015962f8,JsLibInitPhase);
    if (bVar1) {
      extensionKind = EngineInterfaceExtensionKind_JsBuiltIn;
      do {
        pEVar2 = EngineInterfaceObject::GetEngineExtension
                           ((this->super_JavascriptLibraryBase).engineInterfaceObject.ptr,
                            extensionKind);
        if ((pEVar2 != (EngineExtensionObjectBase *)0x0) && (pEVar2->hasBytecode == true)) {
          (*pEVar2->_vptr_EngineExtensionObjectBase[1])(pEVar2);
        }
        extensionKind = extensionKind + EngineInterfaceExtensionKind_Intl;
      } while (extensionKind !=
               (EngineInterfaceExtensionKind_WinRTPromise|EngineInterfaceExtensionKind_Intl));
    }
  }
  return;
}

Assistant:

void JavascriptLibrary::DumpLibraryByteCode()
    {
#if defined(ENABLE_JS_BUILTINS) || defined(ENABLE_INTL_OBJECT)
        // We aren't going to be passing in a number to check range of -dump:LibInit, that will be done by Intl/Promise
        // This is just to force init Intl code if dump:LibInit has been passed
        if (CONFIG_ISENABLED(DumpFlag) && Js::Configuration::Global.flags.Dump.IsEnabled(Js::JsLibInitPhase))
        {
            for (uint i = 0; i <= MaxEngineInterfaceExtensionKind; i++)
            {
                EngineExtensionObjectBase* engineExtension = this->GetEngineInterfaceObject()->GetEngineExtension((Js::EngineInterfaceExtensionKind)i);
                if (engineExtension != nullptr && engineExtension->GetHasByteCode())
                {
                    engineExtension->DumpByteCode();
                }
            }
        }
#endif
    }